

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int pragmaVtabConnect(sqlite3 *db,void *pAux,int argc,char **argv,sqlite3_vtab **ppVtab,char **pzErr
                     )

{
  long lVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  sqlite3_vtab *psVar5;
  undefined8 uVar6;
  long lVar7;
  long in_FS_OFFSET;
  char cVar8;
  sqlite3_str local_128;
  char zBuf [200];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_128.nChar = 0xaaaaaaaa;
  local_128.accError = 0xaa;
  local_128.printfFlags = 0xaa;
  local_128._30_2_ = 0xaaaa;
  memset(zBuf,0xaa,200);
  local_128.db = (sqlite3 *)0x0;
  local_128.nAlloc = 200;
  local_128.mxAlloc = 0;
  local_128.nChar = 0;
  local_128.accError = '\0';
  local_128.printfFlags = '\0';
  local_128.zText = zBuf;
  sqlite3_str_appendall(&local_128,"CREATE TABLE x");
  bVar2 = *(byte *)((long)pAux + 10);
  uVar6 = 0x28;
  for (lVar7 = 0; (uint)lVar7 < (uint)*(byte *)((long)pAux + 0xb); lVar7 = lVar7 + 1) {
    sqlite3_str_appendf(&local_128,"%c\"%s\"",uVar6,pragCName[lVar7 + (ulong)bVar2]);
    uVar6 = 0x2c;
  }
  if ((uint)lVar7 == 0) {
    lVar7 = 1;
    sqlite3_str_appendf(&local_128,"(\"%s\"",*pAux);
  }
  bVar2 = *(byte *)((long)pAux + 9);
  cVar8 = (bVar2 & 0x20) != 0;
  if ((bool)cVar8) {
    sqlite3_str_appendall(&local_128,",arg HIDDEN");
    bVar2 = *(byte *)((long)pAux + 9);
  }
  if (0x3f < bVar2) {
    sqlite3_str_appendall(&local_128,",schema HIDDEN");
    cVar8 = cVar8 + '\x01';
  }
  sqlite3_str_append(&local_128,")",1);
  sqlite3StrAccumFinish(&local_128);
  iVar3 = sqlite3_declare_vtab(db,zBuf);
  if (iVar3 == 0) {
    psVar5 = (sqlite3_vtab *)sqlite3_malloc(0x30);
    iVar3 = 0;
    if (psVar5 == (sqlite3_vtab *)0x0) {
      iVar3 = 7;
      psVar5 = (sqlite3_vtab *)0x0;
    }
    else {
      *(undefined8 *)&psVar5[1].nRef = 0;
      psVar5[1].zErrMsg = (char *)0x0;
      psVar5->zErrMsg = (char *)0x0;
      psVar5[1].pModule = (sqlite3_module *)0x0;
      psVar5->pModule = (sqlite3_module *)0x0;
      *(undefined8 *)&psVar5->nRef = 0;
      *(void **)&psVar5[1].nRef = pAux;
      psVar5[1].pModule = (sqlite3_module *)db;
      *(char *)((long)&psVar5[1].zErrMsg + 1) = (char)lVar7;
      *(char *)&psVar5[1].zErrMsg = cVar8;
    }
  }
  else {
    pcVar4 = sqlite3_errmsg(db);
    psVar5 = (sqlite3_vtab *)0x0;
    pcVar4 = sqlite3_mprintf("%s",pcVar4);
    *pzErr = pcVar4;
  }
  *ppVtab = psVar5;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

static int pragmaVtabConnect(
  sqlite3 *db,
  void *pAux,
  int argc, const char *const*argv,
  sqlite3_vtab **ppVtab,
  char **pzErr
){
  const PragmaName *pPragma = (const PragmaName*)pAux;
  PragmaVtab *pTab = 0;
  int rc;
  int i, j;
  char cSep = '(';
  StrAccum acc;
  char zBuf[200];

  UNUSED_PARAMETER(argc);
  UNUSED_PARAMETER(argv);
  sqlite3StrAccumInit(&acc, 0, zBuf, sizeof(zBuf), 0);
  sqlite3_str_appendall(&acc, "CREATE TABLE x");
  for(i=0, j=pPragma->iPragCName; i<pPragma->nPragCName; i++, j++){
    sqlite3_str_appendf(&acc, "%c\"%s\"", cSep, pragCName[j]);
    cSep = ',';
  }
  if( i==0 ){
    sqlite3_str_appendf(&acc, "(\"%s\"", pPragma->zName);
    i++;
  }
  j = 0;
  if( pPragma->mPragFlg & PragFlg_Result1 ){
    sqlite3_str_appendall(&acc, ",arg HIDDEN");
    j++;
  }
  if( pPragma->mPragFlg & (PragFlg_SchemaOpt|PragFlg_SchemaReq) ){
    sqlite3_str_appendall(&acc, ",schema HIDDEN");
    j++;
  }
  sqlite3_str_append(&acc, ")", 1);
  sqlite3StrAccumFinish(&acc);
  assert( strlen(zBuf) < sizeof(zBuf)-1 );
  rc = sqlite3_declare_vtab(db, zBuf);
  if( rc==SQLITE_OK ){
    pTab = (PragmaVtab*)sqlite3_malloc(sizeof(PragmaVtab));
    if( pTab==0 ){
      rc = SQLITE_NOMEM;
    }else{
      memset(pTab, 0, sizeof(PragmaVtab));
      pTab->pName = pPragma;
      pTab->db = db;
      pTab->iHidden = i;
      pTab->nHidden = j;
    }
  }else{
    *pzErr = sqlite3_mprintf("%s", sqlite3_errmsg(db));
  }

  *ppVtab = (sqlite3_vtab*)pTab;
  return rc;
}